

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureDecodeSkippedCase::setupTest
          (TextureDecodeSkippedCase *this)

{
  Vec4 *in_R8;
  WrapMode in_R9D;
  FragmentShaderParameters shaderParameters;
  SRGBDecode in_stack_ffffffffffffff80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  bool local_30;
  undefined1 *local_2c;
  pointer local_20;
  pointer pbStack_18;
  pointer local_10;
  
  local_40._M_local_buf[0] = '\0';
  local_2c = &DAT_100000001;
  local_20 = (pointer)0x0;
  pbStack_18 = (pointer)0x0;
  local_10 = (pointer)0x0;
  local_30 = false;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&stack0xffffffffffffff68,0,(int)&local_40,in_R8,
             in_R9D,0x3e4ccccd,0x3ecccccd,LINEAR,in_stack_ffffffffffffff80);
  SRGBTestCase::addShaderProgram
            (&this->super_SRGBTestCase,(FragmentShaderParameters *)&stack0xffffffffffffff78);
  (this->super_SRGBTestCase).m_py = 0;
  (this->super_SRGBTestCase).m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  (this->super_SRGBTestCase).m_px = 0;
  FragmentShaderParameters::~FragmentShaderParameters
            ((FragmentShaderParameters *)&stack0xffffffffffffff78);
  return;
}

Assistant:

void TextureDecodeSkippedCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture to DECODE_SKIP_EXT
	//	- store texture on GPU
	//	- in fragment shader, sample the texture using texture*() and render texel values to a color attachment in the FBO
	//	- on the host, read back the pixel values into a tcu::TextureLevel
	//	- analyse the texel values, expecting them in sRGB format i.e. linear space decoding was skipped

	FragmentShaderParameters shaderParameters(SHADEROUTPUTS_ONE, SHADERUNIFORMS_ONE, NULL, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addShaderProgram(shaderParameters);
	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);

	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}